

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall
opengv::relative_pose::modules::Eigensolver_step::operator()
          (Eigensolver_step *this,VectorXd *x,VectorXd *fvec)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Matrix<double,_1,_3,_1,_1,_3> jacobian;
  cayley_t cayley;
  Matrix3d *in_stack_00000868;
  Matrix3d *in_stack_00000870;
  Matrix3d *in_stack_00000878;
  Matrix3d *in_stack_00000880;
  Matrix3d *in_stack_00000888;
  Matrix3d *in_stack_00000890;
  cayley_t *in_stack_000008b0;
  Matrix<double,_1,_3,_1,_1,_3> *in_stack_000008b8;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffff88;
  undefined1 *row;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_ffffffffffffff90;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *this_00;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> local_48 [24];
  undefined1 local_30 [48];
  
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<Eigen::Matrix<double,_1,1,0,_1,1>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix((Matrix<double,_1,_3,_1,_1,_3> *)0xdd5cf6);
  row = local_30;
  this_00 = local_48;
  eigensolver::getSmallestEVwithJacobian
            (in_stack_00000890,in_stack_00000888,in_stack_00000880,in_stack_00000878,
             in_stack_00000870,in_stack_00000868,in_stack_000008b0,in_stack_000008b8);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                     (this_00,(Index)row,0xdd5d3c);
  SVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)row);
  *pSVar3 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                     (this_00,(Index)row,0xdd5d71);
  SVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)row);
  *pSVar3 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                     (this_00,(Index)row,0xdd5da7);
  SVar1 = *pSVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                      (Index)row);
  *pSVar3 = SVar1;
  return 0;
}

Assistant:

int operator()(const Eigen::VectorXd &x, Eigen::VectorXd &fvec) const
  {
    cayley_t cayley = x;
    Eigen::Matrix<double,1,3> jacobian;
    eigensolver::getSmallestEVwithJacobian(
        _xxF,_yyF,_zzF,_xyF,_yzF,_zxF,cayley,jacobian);

    fvec[0] = jacobian(0,0);
    fvec[1] = jacobian(0,1);
    fvec[2] = jacobian(0,2);
    return 0;
  }